

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackTexture.cpp
# Opt level: O0

void __thiscall Rml::CallbackTextureInterface::SaveLayerAsTexture(CallbackTextureInterface *this)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Vector2Type VVar4;
  undefined1 local_20 [8];
  Rectanglei region;
  CallbackTextureInterface *this_local;
  
  region.p1 = (Vector2Type)this;
  if (*this->texture_handle == 0) {
    _local_20 = RenderManager::GetScissorRegion(this->render_manager);
    bVar2 = Rectangle<int>::Valid((Rectangle<int> *)local_20);
    if (bVar2) {
      iVar3 = (*this->render_interface->_vptr_RenderInterface[0x10])();
      *this->texture_handle = CONCAT44(extraout_var,iVar3);
      if (*this->texture_handle != 0) {
        VVar4 = Rectangle<int>::Size((Rectangle<int> *)local_20);
        *this->dimensions = VVar4;
      }
    }
    else {
      bVar2 = Assert("Save layer as texture requires a scissor region to be set first",
                     "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/CallbackTexture.cpp"
                     ,0x4d);
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
    }
  }
  else {
    bVar2 = Assert("Texture already set",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/CallbackTexture.cpp"
                   ,0x46);
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  return;
}

Assistant:

void CallbackTextureInterface::SaveLayerAsTexture() const
{
	if (texture_handle)
	{
		RMLUI_ERRORMSG("Texture already set");
		return;
	}

	const Rectanglei region = render_manager.GetScissorRegion();
	if (!region.Valid())
	{
		RMLUI_ERRORMSG("Save layer as texture requires a scissor region to be set first");
		return;
	}

	texture_handle = render_interface.SaveLayerAsTexture();
	if (texture_handle)
		dimensions = region.Size();
}